

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O1

int segdmp_open_write(char **dirs,char *dfn,char *ifn,uint32 n,uint32 *in_n_seg,uint32 **in_n_frame,
                     segdmp_type_t data_type,uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  uint uVar1;
  uint32 *puVar2;
  uint32 *puVar3;
  uint32 *puVar4;
  uint32 **ppuVar5;
  uint32 *puVar6;
  uint32 *puVar7;
  int32 iVar8;
  cmd_ln_t *cmdln;
  size_t n_elem;
  FILE *__stream;
  FILE *fp;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  uint32 uVar12;
  ulong uVar13;
  uint32 uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  uint32 onefrm;
  uint local_44;
  int local_40;
  uint local_3c;
  char *local_38;
  
  n_stream = i_n_stream;
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = in_n_seg;
  n_frame = in_n_frame;
  printf("dfn is %s\n");
  local_38 = ifn;
  printf("ifn is %s\n",ifn);
  fflush(_stdout);
  uVar16 = 0xffffffff;
  do {
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
  } while (dirs[uVar16] != (char *)0x0);
  cur_type = data_type;
  if (data_type == SEGDMP_TYPE_VQ) {
    pcVar9 = "Producing VQ dump\n";
    lVar11 = 0x1db;
LAB_00106b09:
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,lVar11,pcVar9);
  }
  else {
    if (data_type == SEGDMP_TYPE_MFCC) {
      pcVar9 = "Producing MFCC dump\n";
      lVar11 = 0x1d8;
      goto LAB_00106b09;
    }
    if (data_type == SEGDMP_TYPE_FEAT) {
      pcVar9 = "Producing FEAT dump\n";
      lVar11 = 0x1d5;
      goto LAB_00106b09;
    }
  }
  if (n == 0) {
    uVar17 = 0;
  }
  else {
    uVar16 = 0;
    uVar17 = 0;
    do {
      uVar1 = n_seg[uVar16];
      if (n_frame == (uint32 **)0x0) {
        uVar17 = uVar1 + uVar17;
      }
      else if ((ulong)uVar1 != 0) {
        uVar13 = 0;
        do {
          uVar17 = uVar17 + n_frame[uVar16][uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != n);
  }
  n_id = n;
  id_part = (uint32 *)
            __ckd_calloc__((ulong)n,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x1ec);
  id_off = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ed);
  id_len = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ee);
  if (cur_type == SEGDMP_TYPE_VQ) {
    frame_sz = 4;
  }
  else {
    if (cur_type == SEGDMP_TYPE_MFCC) {
      cmdln = cmd_ln_get();
      lVar11 = cmd_ln_int_r(cmdln,"-ceplen");
      uVar12 = (uint32)lVar11;
    }
    else {
      uVar12 = blksize;
      if (cur_type != SEGDMP_TYPE_FEAT) goto LAB_00106c07;
    }
    frame_sz = uVar12 << 2;
  }
LAB_00106c07:
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x205,"%u total frames; %u frames/dmp max\n",(ulong)uVar17);
  puVar6 = id_part;
  *id_part = 0;
  puVar4 = id_off;
  *id_off = 0;
  puVar7 = id_len;
  ppuVar5 = n_frame;
  puVar3 = n_seg;
  if (n_frame == (uint32 **)0x0) {
    *id_len = *n_seg;
  }
  else if (*n_seg != 0) {
    puVar2 = *n_frame;
    uVar16 = 0;
    do {
      *puVar7 = *puVar7 + puVar2[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar16 < *puVar3);
  }
  puVar7 = id_len;
  puVar3 = n_seg;
  uVar16 = (ulong)(frame_sz * *id_len);
  if (frame_sz * *id_len < 0x7f000001) {
    uVar16 = 1;
    if (1 < n_id) {
      uVar16 = 1;
      uVar12 = 0;
      do {
        uVar14 = frame_sz * puVar7[uVar16 - 1] + puVar4[uVar16 - 1];
        bVar19 = uVar14 < 0x7f000001;
        if (!bVar19) {
          uVar14 = 0;
        }
        uVar12 = (uVar12 + 1) - (uint)bVar19;
        puVar4[uVar16] = uVar14;
        puVar6[uVar16] = uVar12;
        uVar14 = puVar3[uVar16];
        if (ppuVar5 == (uint32 **)0x0) {
          puVar7[uVar16] = uVar14;
        }
        else if (uVar14 != 0) {
          puVar2 = ppuVar5[uVar16];
          uVar13 = 0;
          do {
            puVar7[uVar16] = puVar7[uVar16] + puVar2[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar13 < puVar3[uVar16]);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < n_id);
      uVar16 = (ulong)(uVar12 + 1);
    }
    n_part = (uint32)uVar16;
    if (n_part <= uVar15) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
              ,0x233,"%u of %u directories filled\n",uVar16,(ulong)uVar15);
      dmp_fp = (FILE **)__ckd_calloc__((ulong)n_part,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x23b);
      n_elem = (size_t)n_part;
      if (n_part != 0) {
        uVar16 = 0;
        do {
          sprintf(dmp_fn,"%s/%s",dirs[uVar16],dfn);
          __stream = (FILE *)s3open(dmp_fn,"wb",(uint32 *)0x0);
          dmp_fp[uVar16] = (FILE *)__stream;
          lVar11 = ftell(__stream);
          puVar4 = id_part;
          puVar3 = id_off;
          if (n_id != 0) {
            uVar13 = 0;
            do {
              if (uVar16 == puVar4[uVar13]) {
                puVar3[uVar13] = puVar3[uVar13] + (int)lVar11;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < n_id);
          }
          uVar16 = uVar16 + 1;
          n_elem = (size_t)n_part;
        } while (uVar16 < n_elem);
      }
      idx_fp = (FILE **)__ckd_calloc__(n_elem,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x249);
      if (local_38 == (char *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                ,0x25f,"Assuming prior indices are available and appropriate\n");
      }
      else if (n_part != 0) {
        uVar16 = 0;
        pcVar9 = local_38;
        do {
          sprintf(idx_fn,"%s/%s",dirs[uVar16],pcVar9);
          fp = s3open(idx_fn,"wb",(uint32 *)0x0);
          idx_fp[uVar16] = fp;
          iVar8 = bio_fwrite(&data_type,4,1,fp,0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "unable to write seg dmp file";
            lVar11 = 0x252;
LAB_001072d1:
            err_msg_system(ERR_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,lVar11,pcVar9);
            goto LAB_001072dd;
          }
          iVar8 = bio_fwrite(&n_id,4,1,idx_fp[uVar16],0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "Unable to write index file";
            lVar11 = 299;
            goto LAB_001072d1;
          }
          local_3c = (uint)(n_frame == (uint32 **)0x0);
          iVar8 = bio_fwrite(&local_3c,4,1,idx_fp[uVar16],0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "Unable to write index file";
            lVar11 = 0x137;
            goto LAB_001072d1;
          }
          iVar8 = bio_fwrite(&frame_sz,4,1,idx_fp[uVar16],0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "Unable to write index file";
            lVar11 = 0x13d;
            goto LAB_001072d1;
          }
          uVar13 = (ulong)n_id;
          if (uVar13 == 0) {
            uVar18 = 0;
          }
          else {
            uVar10 = 0;
            do {
              uVar18 = uVar10;
              if (uVar16 == id_part[uVar10]) break;
              uVar10 = uVar10 + 1;
              uVar18 = uVar13;
            } while (uVar13 != uVar10);
          }
          local_40 = 0;
          local_44 = (uint)uVar18;
          if (local_44 < n_id) {
            lVar11 = 0;
            do {
              if (uVar16 != id_part[(uVar18 & 0xffffffff) + lVar11]) break;
              lVar11 = lVar11 + 1;
              local_40 = (int)lVar11;
            } while (n_id - local_44 != local_40);
          }
          iVar8 = bio_fwrite(&local_44,4,1,idx_fp[uVar16],0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "Unable to write index file";
            lVar11 = 0x14d;
            goto LAB_001072d1;
          }
          iVar8 = bio_fwrite(&local_40,4,1,idx_fp[uVar16],0,&ignore);
          if (iVar8 != 1) {
            pcVar9 = "Unable to write index file";
            lVar11 = 0x152;
            goto LAB_001072d1;
          }
          while ((pcVar9 = local_38, local_44 < n_id && (uVar16 == id_part[local_44]))) {
            iVar8 = bio_fwrite(n_seg + local_44,4,1,idx_fp[uVar16],0,&ignore);
            if (iVar8 != 1) {
              pcVar9 = "Unable to write index file";
              lVar11 = 0x159;
              goto LAB_001072d1;
            }
            iVar8 = bio_fwrite(id_off + local_44,4,1,idx_fp[uVar16],0,&ignore);
            if (iVar8 != 1) {
              pcVar9 = "Unable to write index file";
              lVar11 = 0x15e;
              goto LAB_001072d1;
            }
            if ((local_3c == 0) && (uVar13 = (ulong)local_44, n_seg[uVar13] != 0)) {
              lVar11 = 0;
              uVar18 = 0;
              do {
                iVar8 = bio_fwrite((void *)((long)n_frame[uVar13] + lVar11),4,1,idx_fp[uVar16],0,
                                   &ignore);
                if (iVar8 != 1) {
                  pcVar9 = "Unable to write index file";
                  lVar11 = 0x165;
                  goto LAB_001072d1;
                }
                uVar18 = uVar18 + 1;
                uVar13 = (ulong)local_44;
                lVar11 = lVar11 + 4;
              } while (uVar18 < n_seg[uVar13]);
            }
            local_44 = local_44 + 1;
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                  ,0x255,"Created index %s/%s\n",dirs[uVar16],local_38);
          s3close(idx_fp[uVar16]);
          uVar16 = uVar16 + 1;
        } while (uVar16 < n_part);
      }
      ckd_free(idx_fp);
      idx_fp = (FILE **)0x0;
      alloc_frm_buf = frm_buf_sz / frame_sz;
      printf("frm_buf_size is %d frame_sz is %d\n",(ulong)frm_buf_sz,(ulong)frame_sz);
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
              ,0x269,"%u frames buffered before write\n",(ulong)alloc_frm_buf);
      alloc_frm_buf = alloc_frm_buf * frame_sz;
      frm_buf = (char *)__ckd_calloc__((ulong)alloc_frm_buf,1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x26c);
      if (frm_buf != (char *)0x0) {
        h_seg = (seg_t **)
                __ckd_calloc__((ulong)n_id,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x270);
        t_seg = (seg_t **)
                __ckd_calloc__((ulong)n_id,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x271);
        cur_type = data_type;
        return 0;
      }
      puts("died like a pig");
      goto LAB_001072dd;
    }
    pcVar9 = "%u directories required, but only %u given\n";
    lVar11 = 0x237;
    uVar13 = (ulong)uVar15;
  }
  else {
    pcVar9 = "ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n";
    lVar11 = 0x214;
    uVar13 = 0x7f000000;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,lVar11,pcVar9,uVar16,uVar13);
LAB_001072dd:
  exit(1);
}

Assistant:

int
segdmp_open_write(const char **dirs,		/* directories available for dump files */
		  const char *dfn,		/* dump file name */
		  const char *ifn,		/* index file name */
		  uint32 n,			/* # of segment id's (i.e. phones, states, etc.)*/
		  uint32 *in_n_seg,		/* # of segments per id */
		  uint32 **in_n_frame,		/* length of each segment in # of frames */
		  segdmp_type_t data_type,	/* type of data to store in segment dump */
		  uint32 i_n_stream,
		  uint32* i_vecsize,
		  uint32 i_blksize)
{
    uint32 n_dmp_min;
    uint32 n_dmp_frame_max;
    uint32 n_dir;
    uint32 n_tot_frame;
    uint32 i, j;
    uint32 part = 0;
    uint32 hdr_sz;
    
    n_seg = in_n_seg;
    n_frame = in_n_frame;	/* NULL => 1 frame per segment */

    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;

    printf("dfn is %s\n", dfn);
    printf("ifn is %s\n", ifn);
    fflush(stdout);

    for (n_dir = 0; dirs[n_dir]; n_dir++);

    cur_type = data_type;

    if (cur_type == SEGDMP_TYPE_FEAT) {
	E_INFO("Producing FEAT dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	E_INFO("Producing MFCC dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	E_INFO("Producing VQ dump\n");
    }

    for (n_tot_frame = 0, i = 0; i < n; i++) {
	if (n_frame == NULL) {
	    /* one frame segments, so n_seg == n_frame */
	    n_tot_frame += n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		n_tot_frame += n_frame[i][j];
	    }
	}
    }

    n_id = n;

    id_part = ckd_calloc(n_id, sizeof(uint32));
    id_off = ckd_calloc(n_id, sizeof(uint32));
    id_len = ckd_calloc(n_id, sizeof(uint32));
    
    if (cur_type == SEGDMP_TYPE_FEAT) {
	frame_sz = blksize * sizeof(float32);
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	frame_sz = 4;	/* HAQUE */
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	/* Ideally, this module shouldn't be calling cmd_ln_* functions */
	frame_sz = cmd_ln_int32("-ceplen") * sizeof(float32);
    }

    n_dmp_frame_max = (DMP_MAX / frame_sz);
    
    if (DMP_MAX % frame_sz)
	++n_dmp_frame_max;
    
    n_dmp_min = n_tot_frame / n_dmp_frame_max;

    if (n_tot_frame % n_dmp_frame_max)
	++n_dmp_min;
    
    E_INFO("%u total frames; %u frames/dmp max\n", n_tot_frame, n_dmp_frame_max);

    part = 0;
    id_part[0] = part;
    id_off[0] = 0;
    if (n_frame == NULL) {
	id_len[0] = n_seg[0];
    }
    else {
	for (j = 0; j < n_seg[0]; j++) {
	    id_len[0] += n_frame[0][j];
	}
    }

    if (id_len[0] * frame_sz > DMP_MAX) {
	E_FATAL("ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n", id_len[0]*frame_sz, DMP_MAX);
    }

    /* compute dump part, offset and len for all remaining id's */
    for (i = 1; i < n_id; i++) {
	id_off[i] = id_off[i-1] + id_len[i-1] * frame_sz;

	if (id_off[i] > DMP_MAX) {
	    ++part;
	    id_off[i] = 0;
	}

	id_part[i] = part;

	if (n_frame == NULL) {
	    /* i.e. 1 frame per segment */
	    id_len[i] = n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		id_len[i] += n_frame[i][j];
	    }
	}
    }

    ++part;

    n_part = part;

    if (n_part <= n_dir) {
	E_INFO("%u of %u directories filled\n",
	       n_part, n_dir);
    }
    else {
	E_FATAL("%u directories required, but only %u given\n",
		n_part, n_dir);
    }

    /* Create/open the dump files */
    dmp_fp = ckd_calloc(n_part, sizeof(FILE *));
    for (i = 0; i < n_part; i++) {
	sprintf(dmp_fn, "%s/%s", dirs[i], dfn);

	dmp_fp[i] = s3open(dmp_fn, "wb", NULL);

	/* add the file header size to all the offsets computed above. */
	hdr_sz = ftell(dmp_fp[i]);
	for (j = 0; j < n_id; j++) {
	    if (id_part[j] == i)
		id_off[j] += hdr_sz;
	}
    }

    idx_fp = ckd_calloc(n_part, sizeof(FILE *));
    if (ifn) {
	for (i = 0; i < n_part; i++) {
	    /* Create the index file */
	    sprintf(idx_fn, "%s/%s", dirs[i], ifn);
	    
	    idx_fp[i] = s3open(idx_fn, "wb", NULL);
	    
	    if (bio_fwrite((int *)&data_type, sizeof(int), 1, idx_fp[i], 0, &ignore) != 1) {
		E_FATAL_SYSTEM("unable to write seg dmp file");
	    }
	    if (write_idx(i) == S3_SUCCESS) {
		E_INFO("Created index %s/%s\n", dirs[i], ifn);
	    }
	    else {
		E_INFO("Error creating index %s/%s\n", dirs[i], ifn);
	    }
		
	    s3close(idx_fp[i]);
	}
    }
    else {
	E_INFO("Assuming prior indices are available and appropriate\n");
    }

    ckd_free((void *)idx_fp);
    idx_fp = NULL;

    alloc_frm_buf = frm_buf_sz / frame_sz;
    printf("frm_buf_size is %d frame_sz is %d\n", frm_buf_sz , frame_sz);
    fflush(stdout);

    E_INFO("%u frames buffered before write\n", alloc_frm_buf);
    alloc_frm_buf *= frame_sz;			/* make a multiple of frame_sz */

    if ((frm_buf = (void *)ckd_calloc(alloc_frm_buf, sizeof(char)) )==NULL) {
	printf("died like a pig\n");
	exit(1);
    }
    h_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));
    t_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));

    cur_type = data_type;
    
    return S3_SUCCESS;
}